

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O1

void __thiscall Regex::backtrackGroups(Regex *this,ParseData *data)

{
  GroupData *pGVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if (0 < (int)(this->mGroups).mSize) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      pGVar1 = (this->mGroups).mData;
      iVar3 = *(int *)((long)&pGVar1->end_pos + lVar4);
      iVar5 = iVar3 - data->cur_pos;
      if (iVar5 != 0 && data->cur_pos <= iVar3) {
        uVar2 = *(ulong *)((long)&(pGVar1->string)._M_string_length + lVar4);
        lVar6 = uVar2 - (long)iVar5;
        if (uVar2 < (ulong)(long)iVar5) {
          std::__throw_out_of_range_fmt("%s: __pos (which is %zu) > this->size() (which is %zu)");
          if ((getData[abi:cxx11](int)::null_string_abi_cxx11_ == '\0') &&
             (iVar3 = __cxa_guard_acquire(&getData[abi:cxx11](int)::null_string_abi_cxx11_),
             iVar3 != 0)) {
            getData[abi:cxx11](int)::null_string_abi_cxx11_._M_dataplus._M_p =
                 (pointer)&getData[abi:cxx11](int)::null_string_abi_cxx11_.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&getData[abi:cxx11](int)::null_string_abi_cxx11_,"");
            __cxa_atexit(std::__cxx11::string::~string,
                         &getData[abi:cxx11](int)::null_string_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&getData[abi:cxx11](int)::null_string_abi_cxx11_);
          }
          return;
        }
        *(long *)((long)&(pGVar1->string)._M_string_length + lVar4) = lVar6;
        *(undefined1 *)(*(long *)((long)&(pGVar1->string)._M_dataplus._M_p + lVar4) + lVar6) = 0;
        *(int *)((long)&((this->mGroups).mData)->end_pos + lVar4) = data->cur_pos;
      }
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0x28;
    } while (lVar7 < (int)(this->mGroups).mSize);
  }
  return;
}

Assistant:

void	Regex::backtrackGroups( ParseData *data )
{
	for ( int i = 0; i < (int)mGroups.size(); i++ )
	{
		if ( mGroups[ i ].end_pos > data->cur_pos )
		{
			std::string &s = mGroups[ i ].string;
			s.erase( s.length() - ( mGroups[ i ].end_pos - data->cur_pos ) );
			mGroups[ i ].end_pos = data->cur_pos;
		}
	}
}